

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_chk2cmp2_8_al(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar2 = m68ki_read_imm_16();
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x3c));
  uVar3 = m68ki_read_imm_32();
  uVar4 = m68ki_read_8_fc(uVar3,m68ki_address_space | m68ki_cpu.s_flag);
  uVar7 = (uint)(char)uVar4;
  uVar3 = m68ki_read_8_fc(uVar3 + 1,m68ki_address_space | m68ki_cpu.s_flag);
  uVar6 = (int)(char)bVar1;
  if ((short)uVar2 < 0) {
    uVar6 = (uint)bVar1;
  }
  uVar5 = (uint)(char)uVar3;
  m68ki_cpu.not_z_flag = (uint)(uVar7 != uVar6 && uVar5 != uVar6);
  m68ki_cpu.c_flag =
       (uint)(((int)uVar5 < (int)uVar6 || (int)uVar5 < (int)uVar7) || (int)uVar6 < (int)uVar7) << 8;
  if (((uVar2 >> 0xb & 1) != 0) &&
     (((int)uVar5 < (int)uVar6 || (int)uVar5 < (int)uVar7) || (int)uVar6 < (int)uVar7)) {
    m68ki_exception_trap(6);
    return;
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_8_al(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xff;
		uint ea = EA_AL_8();
		sint lower_bound = (int8)m68ki_read_8(ea);
		sint upper_bound = (int8)m68ki_read_8(ea + 1);

		if(!BIT_F(word2))
			compare = (int32)(int8)compare;
      
 		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||

    FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;
	}
	m68ki_exception_illegal();
}